

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O1

Result wabt::ValidateScript(Script *script,Errors *errors,ValidateOptions *options)

{
  long *plVar1;
  long lVar2;
  Action *action;
  anon_union_8_2_516a9242_for_ActionResult_2 *paVar3;
  char *in_R8;
  long *plVar4;
  ActionResult AVar5;
  ScriptValidator validator;
  ScriptValidator local_300;
  Expectation *local_2e0;
  Validator local_2d8;
  
  local_300.result_.enum_ = Ok;
  plVar1 = *(long **)&script->field_0x8;
  local_300.script_ = script;
  local_300.errors_ = errors;
  local_300.options_ = options;
  for (plVar4 = *(long **)script; plVar4 != plVar1; plVar4 = plVar4 + 1) {
    lVar2 = *plVar4;
    switch(*(undefined4 *)(lVar2 + 8)) {
    case 0:
    case 1:
      local_2d8.super_Delegate._vptr_Delegate = (_func_int **)&PTR__Validator_0016a3c8;
      local_2d8.options_ = local_300.options_;
      local_2d8.errors_ = local_300.errors_;
      SharedValidator::SharedValidator(&local_2d8.validator_,local_300.errors_,local_300.options_);
      local_2d8.result_.enum_ = Ok;
      local_2d8.current_module_ = (Module *)(lVar2 + 0x10);
      anon_unknown_4::Validator::CheckModule(&local_2d8);
      local_2d8.super_Delegate._vptr_Delegate = (_func_int **)&PTR__Validator_0016a3c8;
      SharedValidator::~SharedValidator(&local_2d8.validator_);
      break;
    case 2:
    case 9:
    case 10:
    case 0xb:
      anon_unknown_4::ScriptValidator::CheckAction(&local_300,*(Action **)(lVar2 + 0x10));
      break;
    case 8:
      action = *(Action **)(lVar2 + 0x10);
      AVar5 = anon_unknown_4::ScriptValidator::CheckAction(&local_300,action);
      if (AVar5.kind == Type) {
        local_2d8.super_Delegate._vptr_Delegate = (_func_int **)0x0;
        local_2d8.options_ = (ValidateOptions *)0x0;
        local_2d8.errors_ = (Errors *)0x0;
        local_2e0 = *(Expectation **)(lVar2 + 0x18);
        paVar3 = (anon_union_8_2_516a9242_for_ActionResult_2 *)operator_new(8);
        local_2d8.options_ = (ValidateOptions *)(paVar3 + 1);
        paVar3->types = (TypeVector *)AVar5.field_1;
        local_2d8.super_Delegate._vptr_Delegate = (_func_int **)paVar3;
        local_2d8.errors_ = (Errors *)local_2d8.options_;
        anon_unknown_4::ScriptValidator::CheckExpectationTypes
                  (&local_300,(Location *)(action + 8),(TypeVector *)&local_2d8,local_2e0,in_R8);
        operator_delete(paVar3,8);
      }
      else if (AVar5.kind == Types) {
        anon_unknown_4::ScriptValidator::CheckExpectationTypes
                  (&local_300,(Location *)(action + 8),AVar5.field_1.types,
                   *(Expectation **)(lVar2 + 0x18),in_R8);
      }
    }
  }
  return (Result)local_300.result_.enum_;
}

Assistant:

ScriptValidator::ScriptValidator(Errors* errors,
                                 const Script* script,
                                 const ValidateOptions& options)
    : options_(options), errors_(errors), script_(script) {}